

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O2

int Abc_GraphDeriveGia_rec
              (Gia_Man_t *p,int Lev,int Node,Vec_Wec_t *vNodes,int **pCache,int *pBuffer,
              Vec_Int_t *vEdges)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  
  if (Node != -2) {
    if (Node == -1) {
      iVar1 = 0;
    }
    else {
      iVar1 = pCache[Lev][Node];
      if (iVar1 == -1) {
        pBuffer[Lev] = 0;
        pVVar4 = Vec_WecEntry(vNodes,Lev);
        iVar1 = Vec_IntEntry(pVVar4,Node * 2);
        iVar1 = Abc_GraphDeriveGia_rec(p,Lev + 1,iVar1,vNodes,pCache,pBuffer,vEdges);
        pBuffer[Lev] = 1;
        pVVar4 = Vec_WecEntry(vNodes,Lev);
        iVar2 = Vec_IntEntry(pVVar4,Node * 2 + 1);
        iVar2 = Abc_GraphDeriveGia_rec(p,Lev + 1,iVar2,vNodes,pCache,pBuffer,vEdges);
        iVar3 = Vec_IntEntry(p->vCis,Lev);
        pGVar5 = Gia_ManObj(p,iVar3);
        iVar3 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)pGVar5 & 0xfffffffffffffffe));
        iVar3 = Abc_Var2Lit(iVar3,(uint)pGVar5 & 1);
        iVar1 = Gia_ManHashMux(p,iVar3,iVar2,iVar1);
        pCache[Lev][Node] = iVar1;
      }
    }
    return iVar1;
  }
  return 1;
}

Assistant:

int Abc_GraphDeriveGia_rec( Gia_Man_t * p, int Lev, int Node, Vec_Wec_t * vNodes, int ** pCache, int * pBuffer, Vec_Int_t * vEdges )
{
    int Res0, Res1;
    if ( Node == -2 )
        return 1;
    if ( Node == -1 )
        return 0;
    if ( pCache[Lev][Node] != -1 )
        return pCache[Lev][Node];
    pBuffer[Lev] = 0;
    Res0 = Abc_GraphDeriveGia_rec( p, Lev+1, Vec_IntEntry( Vec_WecEntry(vNodes, Lev), 2*Node   ), vNodes, pCache, pBuffer, vEdges );
    pBuffer[Lev] = 1;
    Res1 = Abc_GraphDeriveGia_rec( p, Lev+1, Vec_IntEntry( Vec_WecEntry(vNodes, Lev), 2*Node+1 ), vNodes, pCache, pBuffer, vEdges );
    return ( pCache[Lev][Node] = Gia_ManHashMux(p, Gia_Obj2Lit(p, Gia_ManCi(p, Lev)), Res1, Res0) );
}